

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randr.c
# Opt level: O1

natwm_error randr_get_screens(natwm_state *state,randr_monitor ***result,size_t *length)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  xcb_randr_crtc_t xVar5;
  bool bVar6;
  undefined4 uVar7;
  uint uVar8;
  void *__ptr;
  randr_monitor **pprVar9;
  long lVar10;
  randr_monitor **__ptr_00;
  void *__ptr_01;
  randr_monitor *prVar11;
  natwm_error nVar12;
  ulong __nmemb;
  ulong uVar13;
  int i;
  ulong uVar14;
  randr_monitor **local_38;
  xcb_generic_error_t *err;
  
  local_38 = (randr_monitor **)0x0;
  uVar7 = xcb_randr_get_screen_resources(state->xcb,state->screen->root);
  __ptr = (void *)xcb_randr_get_screen_resources_reply(state->xcb,uVar7,&local_38);
  if ((local_38 == (randr_monitor **)0x0) && (__ptr != (void *)0x0)) {
    uVar8 = xcb_randr_get_screen_resources_outputs_length(__ptr);
    if ((int)uVar8 < 1) {
      __assert_fail("screen_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/randr.c"
                    ,0x2f,
                    "enum natwm_error randr_get_screens(const struct natwm_state *, struct randr_monitor ***, size_t *)"
                   );
    }
    __nmemb = (ulong)uVar8;
    pprVar9 = (randr_monitor **)calloc(__nmemb,8);
    if (pprVar9 == (randr_monitor **)0x0) {
      nVar12 = MEMORY_ALLOCATION_ERROR;
    }
    else {
      lVar10 = xcb_randr_get_screen_resources_outputs(__ptr);
      uVar14 = 0;
      do {
        uVar7 = xcb_randr_get_output_info(state->xcb,*(undefined4 *)(lVar10 + uVar14 * 4),0);
        __ptr_00 = (randr_monitor **)xcb_randr_get_output_info_reply(state->xcb,uVar7,&local_38);
        if ((local_38 == (randr_monitor **)0x0) || (__ptr_00 != (randr_monitor **)0x0)) {
          uVar7 = xcb_randr_get_crtc_info(state->xcb,*(undefined4 *)((long)__ptr_00 + 0xc),0);
          __ptr_01 = (void *)xcb_randr_get_crtc_info_reply(state->xcb,uVar7,&local_38);
          if ((local_38 != (randr_monitor **)0x0) && (__ptr_01 == (void *)0x0)) {
            free(__ptr_00);
            goto LAB_00108dcd;
          }
          uVar1 = *(ushort *)((long)__ptr_01 + 0xc);
          uVar2 = *(ushort *)((long)__ptr_01 + 0xe);
          uVar3 = *(ushort *)((long)__ptr_01 + 0x10);
          uVar4 = *(ushort *)((long)__ptr_01 + 0x12);
          xVar5 = *(xcb_randr_crtc_t *)((long)__ptr_00 + 0xc);
          prVar11 = (randr_monitor *)malloc(0xc);
          if (prVar11 == (randr_monitor *)0x0) {
            prVar11 = (randr_monitor *)0x0;
          }
          else {
            prVar11->id = xVar5;
            prVar11->rect =
                 (xcb_rectangle_t)
                 ((ulong)uVar2 * 0x10000 + (ulong)uVar1 | (ulong)uVar3 << 0x20 |
                 (ulong)uVar4 << 0x30);
          }
          if (prVar11 == (randr_monitor *)0x0) {
            bVar6 = true;
            __ptr_00 = pprVar9;
            if (uVar14 != 0) {
              uVar13 = 0;
              do {
                if (pprVar9[uVar13] != (randr_monitor *)0x0) {
                  free(pprVar9[uVar13]);
                }
                uVar13 = uVar13 + 1;
              } while (uVar14 != uVar13);
            }
          }
          else {
            pprVar9[uVar14] = prVar11;
            free(__ptr_01);
            bVar6 = false;
          }
        }
        else {
          internal_logger(natwm_logger,LEVEL_WARNING,"Failed to get info for a RANDR screen.");
LAB_00108dcd:
          bVar6 = false;
          __ptr_00 = local_38;
        }
        free(__ptr_00);
        if (bVar6) {
          return MEMORY_ALLOCATION_ERROR;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != __nmemb);
      xcb_randr_select_input(state->xcb,state->screen->root,1);
      *result = pprVar9;
      *length = __nmemb;
      nVar12 = NO_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to get RANDR screens");
    nVar12 = GENERIC_ERROR;
    if (__ptr == (void *)0x0) {
      return GENERIC_ERROR;
    }
  }
  free(__ptr);
  return nVar12;
}

Assistant:

enum natwm_error randr_get_screens(const struct natwm_state *state, struct randr_monitor ***result,
                                   size_t *length)
{
        xcb_generic_error_t *err = XCB_NONE;

        xcb_randr_get_screen_resources_cookie_t resources_cookie
                = xcb_randr_get_screen_resources(state->xcb, state->screen->root);
        xcb_randr_get_screen_resources_reply_t *resources_reply
                = xcb_randr_get_screen_resources_reply(state->xcb, resources_cookie, &err);

        if (err != XCB_NONE || resources_reply == NULL) {
                LOG_ERROR(natwm_logger, "Failed to get RANDR screens");

                if (resources_reply != NULL) {
                        free(resources_reply);
                }

                return GENERIC_ERROR;
        }

        int screen_count = xcb_randr_get_screen_resources_outputs_length(resources_reply);

        assert(screen_count > 0);

        struct randr_monitor **monitors
                = calloc((size_t)screen_count, sizeof(struct randr_monitor *));

        if (monitors == NULL) {
                free(resources_reply);

                return MEMORY_ALLOCATION_ERROR;
        }

        xcb_randr_output_t *outputs = xcb_randr_get_screen_resources_outputs(resources_reply);

        for (int i = 0; i < screen_count; ++i) {
                xcb_randr_get_output_info_cookie_t cookie
                        = xcb_randr_get_output_info(state->xcb, outputs[i], XCB_CURRENT_TIME);
                xcb_randr_get_output_info_reply_t *output_info_reply
                        = xcb_randr_get_output_info_reply(state->xcb, cookie, &err);

                if (err != XCB_NONE && output_info_reply == NULL) {
                        LOG_WARNING(natwm_logger, "Failed to get info for a RANDR screen.");

                        free(err);

                        continue;
                }

                xcb_randr_get_crtc_info_cookie_t crtc_info_cookie = xcb_randr_get_crtc_info(
                        state->xcb, output_info_reply->crtc, XCB_CURRENT_TIME);
                xcb_randr_get_crtc_info_reply_t *crtc_info_reply
                        = xcb_randr_get_crtc_info_reply(state->xcb, crtc_info_cookie, &err);

                if (err != XCB_NONE && crtc_info_reply == NULL) {
                        // We encounter this when we find an inactive RANDR
                        // screens
                        free(output_info_reply);
                        free(err);

                        continue;
                }

                xcb_rectangle_t screen_rect = {
                        .x = crtc_info_reply->x,
                        .y = crtc_info_reply->y,
                        .width = crtc_info_reply->width,
                        .height = crtc_info_reply->height,
                };

                struct randr_monitor *monitor
                        = randr_monitor_create(output_info_reply->crtc, screen_rect);

                if (monitor == NULL) {
                        // Mem error, need to free existing monitors
                        for (int j = 0; j < i; ++j) {
                                if (monitors[j] != NULL) {
                                        randr_monitor_destroy(monitors[j]);
                                }
                        }

                        free(monitors);

                        return MEMORY_ALLOCATION_ERROR;
                }

                monitors[i] = monitor;

                free(crtc_info_reply);
                free(output_info_reply);
        }

        // Listen for events
        xcb_randr_select_input(
                state->xcb, state->screen->root, XCB_RANDR_NOTIFY_MASK_SCREEN_CHANGE);

        *result = monitors;
        *length = (size_t)screen_count;

        free(resources_reply);

        return NO_ERROR;
}